

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12dGPUCachePolicy.cpp
# Opt level: O0

GMM_STATUS __thiscall GmmLib::GmmGen12dGPUCachePolicy::SetupPAT(GmmGen12dGPUCachePolicy *this)

{
  GMM_PRIVATE_PAT *pGVar1;
  uint local_1c;
  uint32_t i;
  GMM_PRIVATE_PAT *pPATTlbElement;
  GmmGen12dGPUCachePolicy *this_local;
  
  pGVar1 = Context::GetPrivatePATTable
                     ((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                      super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                      super_GmmCachePolicyCommon.pGmmLibContext);
  for (local_1c = 0;
      local_1c <
      (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
      super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.NumPATRegisters;
      local_1c = local_1c + 1) {
    pGVar1[local_1c].Value = pGVar1[local_1c].Value & 0xfffffffc;
    pGVar1[local_1c].Value = pGVar1[local_1c].Value & 0xfffffff3;
    pGVar1[local_1c].Value = pGVar1[local_1c].Value & 0xf;
  }
  pGVar1->Value = pGVar1->Value & 0xfffffffc;
  pGVar1->Value = pGVar1->Value & 0xfffffff3;
  pGVar1->Value = pGVar1->Value & 0xf;
  pGVar1[1].Value = pGVar1[1].Value & 0xfffffffc | 1;
  pGVar1[1].Value = pGVar1[1].Value & 0xfffffff3;
  pGVar1[1].Value = pGVar1[1].Value & 0xf;
  pGVar1[2].Value = pGVar1[2].Value & 0xfffffffc | 2;
  pGVar1[2].Value = pGVar1[2].Value & 0xfffffff3;
  pGVar1[2].Value = pGVar1[2].Value & 0xf;
  pGVar1[3].Value = pGVar1[3].Value & 0xfffffffc | 3;
  pGVar1[3].Value = pGVar1[3].Value & 0xfffffff3;
  pGVar1[3].Value = pGVar1[3].Value & 0xf;
  pGVar1[4].Value = pGVar1[4].Value & 0xfffffffc | 2;
  pGVar1[4].Value = pGVar1[4].Value & 0xfffffff3 | 4;
  pGVar1[4].Value = pGVar1[4].Value & 0xf;
  pGVar1[5].Value = pGVar1[5].Value & 0xfffffffc | 3;
  pGVar1[5].Value = pGVar1[5].Value & 0xfffffff3 | 4;
  pGVar1[5].Value = pGVar1[5].Value & 0xf;
  pGVar1[6].Value = pGVar1[6].Value & 0xfffffffc | 2;
  pGVar1[6].Value = pGVar1[6].Value & 0xfffffff3 | 8;
  pGVar1[6].Value = pGVar1[6].Value & 0xf;
  pGVar1[7].Value = pGVar1[7].Value & 0xfffffffc | 3;
  pGVar1[7].Value = pGVar1[7].Value & 0xfffffff3 | 8;
  pGVar1[7].Value = pGVar1[7].Value & 0xf;
  *(undefined4 *)&(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.field_0x2c = 7;
  return GMM_SUCCESS;
}

Assistant:

GMM_STATUS GmmLib::GmmGen12dGPUCachePolicy::SetupPAT()
{
    GMM_PRIVATE_PAT *pPATTlbElement = &(pGmmLibContext->GetPrivatePATTable()[0]);

#define L3_UC (0x0)
#define L3_WC (0x1)
#define L3_WT (0x2)
#define L3_WB (0x3)

#define GMM_DEFINE_PAT_ELEMENT(indx, CLOS, L3Caching)       \
    {                                                       \
        pPATTlbElement[indx].Xe_HPC.MemoryType = L3Caching; \
        pPATTlbElement[indx].Xe_HPC.L3CLOS     = CLOS;      \
        pPATTlbElement[indx].Xe_HPC.Reserved   = 0;         \
    }

    // clang-format off

    // Default PAT Table
    for (uint32_t i = 0; i < NumPATRegisters; i++)
    {   //                      Index      CLOS       CachingPolicy
        GMM_DEFINE_PAT_ELEMENT( i,          0              , L3_UC );
    }

    // Fixed PAT Table
    // Group: CLOS0
    //                      Index CLOS          CachingPolicy
    GMM_DEFINE_PAT_ELEMENT( 0    , 0              , L3_UC )    // PATRegValue = 0x0
     GMM_DEFINE_PAT_ELEMENT( 1    , 0              , L3_WC )    // PATRegValue = 0x1
    GMM_DEFINE_PAT_ELEMENT( 2    , 0              , L3_WT )    // PATRegValue = 0x2
    GMM_DEFINE_PAT_ELEMENT( 3    , 0              , L3_WB )    // PATRegValue = 0x3
    //Group: CLOS1
    GMM_DEFINE_PAT_ELEMENT( 4    , 1              , L3_WT )    // PATRegValue = 0x6
    GMM_DEFINE_PAT_ELEMENT( 5    , 1              , L3_WB )    // PATRegValue = 0x7
    //Group: CLOS2
    GMM_DEFINE_PAT_ELEMENT( 6    , 2              , L3_WT )    // PATRegValue = 0xA
    GMM_DEFINE_PAT_ELEMENT( 7    , 2              , L3_WB )    // PATRegValue = 0xB

    CurrentMaxPATIndex = 7;

// clang-format on
#undef GMM_DEFINE_PAT_ELEMENT
#undef L3_UC
#undef L3_WC
#undef L3_WT
#undef L3_WB
    return GMM_SUCCESS;
}